

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODTree.cpp
# Opt level: O1

void __thiscall
RandomForest::ODTree<double>::MultipleParameterBoostrapSampling
          (ODTree<double> *this,int oldNs,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_list)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  vector<int,std::allocator<int>> *pvVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int oldPosN;
  double dVar11;
  undefined8 extraout_XMM0_Qb;
  double dVar12;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> tempPosSampledList;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> outputSampledList;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_78;
  vector<int,std::allocator<int>> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  peVar1 = (this->posTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->negTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar3 = (peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4 = (peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  UpdateTrainDataList(this,oldNs);
  peVar1 = (this->posTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->negTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar9 = (int)((ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  iVar10 = (int)((ulong)((long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  dVar11 = (double)iVar9 / (double)iVar10;
  dVar12 = 1.0 / dVar11;
  if (this->samplingType == DownSamplingMajority) {
    local_48 = 1.0;
    if (dVar11 <= 1.0) {
      local_48 = dVar11;
    }
    uStack_40 = 0;
    local_58 = (double)(~-(ulong)(1.0 <= dVar11) & 0x3ff0000000000000 |
                       (ulong)dVar12 & -(ulong)(1.0 <= dVar11));
  }
  else {
    bVar8 = 1.0 <= dVar11;
    if (dVar11 <= 1.0) {
      dVar11 = 1.0;
    }
    local_58 = (double)(~-(ulong)bVar8 & (ulong)dVar12 | -(ulong)bVar8 & 0x3ff0000000000000);
    local_48 = dVar11;
    uStack_40 = extraout_XMM0_Qb;
  }
  uStack_50 = 0;
  local_68 = (vector<int,std::allocator<int>> *)operator_new(0x18);
  *(undefined8 *)local_68 = 0;
  *(pointer *)(local_68 + 8) = (pointer)0x0;
  *(pointer *)(local_68 + 0x10) = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<int,std::allocator<int>>*>
            (&local_60,(vector<int,_std::allocator<int>_> *)local_68);
  oldPosN = (int)((ulong)((long)piVar3 - (long)piVar4) >> 2);
  if (oldPosN < iVar10) {
    local_78.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_78.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    GetPosNewAddedSampledList(this,oldPosN,local_48,&local_78);
    pvVar7 = (vector<int,std::allocator<int>> *)
             (this->posSampledList).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (pvVar7,*(undefined8 *)(pvVar7 + 8),
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_68,*(undefined8 *)(local_68 + 8),
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_78.
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  iVar10 = (int)((ulong)((long)piVar5 - (long)piVar6) >> 2);
  if (iVar10 < iVar9) {
    local_78.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_78.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    GetNegNewAddedSampledList(this,iVar10,local_58,&local_78);
    pvVar7 = (vector<int,std::allocator<int>> *)
             (this->negSampledList).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (pvVar7,*(undefined8 *)(pvVar7 + 8),
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_68,*(undefined8 *)(local_68 + 8),
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_78.
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  (o_list->super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)local_68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(o_list->
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount,&local_60);
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  return;
}

Assistant:

void RandomForest::ODTree<T>::MultipleParameterBoostrapSampling(int oldNs, std::shared_ptr<std::vector<int> > *o_list)
{
    int oldPosN=posTrainDataList->size();
    int oldNegN=negTrainDataList->size();
    UpdateTrainDataList(oldNs);
    int newPosN=posTrainDataList->size();
    int newNegN=negTrainDataList->size();

    double imbalanceRatio=static_cast<double>(newNegN)/newPosN;
    double posLambda, negLambda;
    if(samplingType==DownSamplingMajority)
    {
        posLambda=imbalanceRatio>=1.0 ? 1.0:imbalanceRatio;
        negLambda=imbalanceRatio>=1.0 ? 1.0/imbalanceRatio:1.0;
    }
    else{
        posLambda=imbalanceRatio>=1.0 ? imbalanceRatio:1.0;
        negLambda=imbalanceRatio>=1.0 ? 1.0:1.0/imbalanceRatio;
    }
    
    std::shared_ptr<std::vector<int> > outputSampledList(new std::vector<int>);
    if(newPosN>oldPosN)
    {
        std::shared_ptr<std::vector<int> > tempPosSampledList;
        GetPosNewAddedSampledList(oldPosN, posLambda, &tempPosSampledList);
        posSampledList->insert(posSampledList->end(), tempPosSampledList->begin(), tempPosSampledList->end());
        outputSampledList->insert(outputSampledList->end(), tempPosSampledList->begin(), tempPosSampledList->end());
    }
    if(newNegN>oldNegN)
    {
        std::shared_ptr<std::vector<int> > tempNegSampledList;
        GetNegNewAddedSampledList(oldNegN, negLambda, &tempNegSampledList);
        negSampledList->insert(negSampledList->end(), tempNegSampledList->begin(), tempNegSampledList->end());
        outputSampledList->insert(outputSampledList->end(), tempNegSampledList->begin(), tempNegSampledList->end());
    }
    *o_list=outputSampledList;
}